

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcStreamAnchor * __thiscall CTcDataStream::find_anchor(CTcDataStream *this,ulong ofs)

{
  ulong uVar1;
  ulong in_RSI;
  long in_RDI;
  CTcStreamAnchor *cur;
  CTcStreamAnchor *local_20;
  
  local_20 = *(CTcStreamAnchor **)(in_RDI + 0x48);
  while( true ) {
    if (local_20 == (CTcStreamAnchor *)0x0) {
      return (CTcStreamAnchor *)0x0;
    }
    uVar1 = CTcStreamAnchor::get_ofs(local_20);
    if (uVar1 == in_RSI) break;
    local_20 = local_20->nxt_;
  }
  return local_20;
}

Assistant:

CTcStreamAnchor *CTcDataStream::find_anchor(ulong ofs) const
{
    CTcStreamAnchor *cur;

    /* scan the anchor list */
    for (cur = first_anchor_ ; cur != 0 ; cur = cur->nxt_)
    {
        /* if this one has the desired offset, return it */
        if (cur->get_ofs() == ofs)
            return cur;
    }

    /* didn't find it */
    return 0;
}